

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O2

int32_t uloc_addLikelySubtags_63
                  (char *localeID,char *maximizedLocaleID,int32_t maximizedLocaleIDCapacity,
                  UErrorCode *err)

{
  char cVar1;
  int iVar2;
  UBool UVar3;
  int32_t iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  char *__s;
  int32_t length;
  int32_t local_fc;
  int32_t scriptLength;
  int32_t langLength;
  char region [4];
  char script [6];
  char lang [12];
  char localeBuffer [157];
  
  UVar3 = do_canonicalize(localeID,localeBuffer,(int32_t)err,err);
  if (UVar3 != '\0') {
    langLength = 0xc;
    scriptLength = 6;
    local_fc = 4;
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      if (0 < maximizedLocaleIDCapacity && maximizedLocaleID != (char *)0x0) {
        iVar4 = parseTagString(localeBuffer,lang,&langLength,script,&scriptLength,region,&local_fc,
                               err);
        if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
          for (__s = localeBuffer + iVar4; (*__s == '_' || (*__s == '-')); __s = __s + 1) {
          }
          sVar5 = strlen(__s);
          uVar6 = 0;
          uVar7 = 0;
          if (0 < (int)sVar5) {
            uVar7 = sVar5 & 0xffffffff;
          }
          iVar8 = 0;
          for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            cVar1 = __s[uVar6];
            iVar2 = 0;
            if ((cVar1 != '-') && (cVar1 != '_')) {
              if (cVar1 == '@') break;
              if (8 < iVar8) goto LAB_0027fb14;
              iVar2 = iVar8 + 1;
            }
            iVar8 = iVar2;
          }
          iVar4 = createLikelySubtagsString
                            (lang,langLength,script,scriptLength,region,local_fc,__s,(int)sVar5,
                             maximizedLocaleID,maximizedLocaleIDCapacity,err);
          if (iVar4 == 0) {
            sVar5 = strlen(localeBuffer);
            length = (int32_t)sVar5;
            iVar4 = maximizedLocaleIDCapacity;
            if (length < maximizedLocaleIDCapacity) {
              iVar4 = length;
            }
            memcpy(maximizedLocaleID,localeBuffer,(long)iVar4);
            iVar4 = u_terminateChars_63(maximizedLocaleID,maximizedLocaleIDCapacity,length,err);
            return iVar4;
          }
          return iVar4;
        }
        if (*err != U_BUFFER_OVERFLOW_ERROR) {
          return -1;
        }
      }
LAB_0027fb14:
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_addLikelySubtags(const char*    localeID,
         char* maximizedLocaleID,
         int32_t maximizedLocaleIDCapacity,
         UErrorCode* err)
{
    char localeBuffer[ULOC_FULLNAME_CAPACITY];

    if (!do_canonicalize(
        localeID,
        localeBuffer,
        sizeof(localeBuffer),
        err)) {
        return -1;
    }
    else {
        return _uloc_addLikelySubtags(
                    localeBuffer,
                    maximizedLocaleID,
                    maximizedLocaleIDCapacity,
                    err);
    }    
}